

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfData.c
# Opt level: O2

void Cnf_ReadMsops(char **ppSopSizes,char ***ppSops)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char **ppcVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  size_t __size;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  char Map [256];
  
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    Map[lVar3] = -1;
  }
  for (lVar3 = 0; lVar3 != 0x51; lVar3 = lVar3 + 1) {
    Map["!#&()*+,-.0123456789:;<=>?ABCDEFGHIJKLMNOPQRSTUVWXYZ[]abcdefghijklmnopqrstuvwxyz|"[lVar3]]
         = (char)lVar3;
  }
  uVar13 = 0xffffffffffffffff;
  __size = 0xffffffffffffffb5;
  ppcVar4 = s_Data4;
  do {
    uVar13 = uVar13 + 1;
    __size = __size + 0x4b;
    if (99999 < uVar13) break;
    pcVar8 = *ppcVar4;
    ppcVar4 = ppcVar4 + 1;
  } while (pcVar8 != (char *)0x0);
  if (99999 < uVar13) {
    __assert_fail("Size < 100000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfData.c"
                  ,0x11cd,"void Cnf_ReadMsops(char **, char ***)");
  }
  pcVar5 = (char *)malloc(__size);
  pcVar8 = pcVar5;
  for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
    pcVar7 = s_Data4[uVar6];
    for (lVar3 = 0; lVar3 != 0x4b; lVar3 = lVar3 + 1) {
      cVar11 = -1;
      if ((long)pcVar7[lVar3] != 0x20) {
        cVar11 = Map[pcVar7[lVar3]];
      }
      pcVar8[lVar3] = cVar11;
    }
    pcVar8 = pcVar8 + 0x4b;
  }
  pcVar7 = (char *)malloc(0x10000);
  ppcVar4 = (char **)malloc(0x80000);
  *pcVar7 = '\0';
  *ppcVar4 = (char *)0x0;
  iVar2 = 1;
  uVar13 = (ulong)pcVar5 & 0xffffffff;
  pcVar8 = pcVar5;
  while( true ) {
    if (0xffff < iVar2) break;
    if (*pcVar8 == -1) {
      pcVar7[iVar2] = (char)uVar13 - (char)pcVar5;
      ppcVar4[iVar2] = pcVar5;
      pcVar5 = pcVar8 + 1;
      iVar2 = iVar2 + 1;
    }
    uVar13 = (ulong)(byte)((char)uVar13 + 1);
    pcVar8 = pcVar8 + 1;
  }
  *ppSopSizes = pcVar7;
  *ppSops = ppcVar4;
  uVar13 = 1;
  do {
    if (uVar13 == 0x10000) {
      return;
    }
    bVar1 = pcVar7[uVar13];
    uVar6 = 0;
    if ((char)bVar1 < '\x01') {
      bVar1 = 0;
    }
    uVar12 = 0;
    for (; uVar6 != bVar1; uVar6 = uVar6 + 1) {
      uVar9 = 0xffff;
      iVar2 = (int)ppcVar4[uVar13][uVar6];
      for (uVar10 = 3; -1 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
        if (iVar2 % 3 == 1) {
          uVar9 = uVar9 & (&DAT_007567e4)[uVar10 * 2];
        }
        else if (iVar2 % 3 == 0) {
          uVar9 = uVar9 & (&DAT_007567e0)[uVar10 * 2];
        }
        iVar2 = iVar2 / 3;
      }
      uVar12 = (ulong)((uint)uVar12 | uVar9);
    }
    bVar14 = uVar13 == uVar12;
    uVar13 = uVar13 + 1;
  } while (bVar14);
  __assert_fail("uTruth == i",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfData.c"
                ,0x11fb,"void Cnf_ReadMsops(char **, char ***)");
}

Assistant:

void Cnf_ReadMsops( char ** ppSopSizes, char *** ppSops )
{
    unsigned uMasks[4][2] = {
        { 0x5555, 0xAAAA },
        { 0x3333, 0xCCCC },
        { 0x0F0F, 0xF0F0 },
        { 0x00FF, 0xFF00 }
    };
    char Map[256], * pPrev, * pMemory;
    char * pSopSizes, ** pSops;
    int i, k, b, Size;

    // map chars into their numbers
    for ( i = 0; i < 256; i++ )
        Map[i] = (char)(-1);
    for ( i = 0; i < 81; i++ )
        Map[(int)s_Data3[i]] = (char)i;

    // count the number of strings
    for ( Size = 0; s_Data4[Size] && Size < 100000; Size++ );
    assert( Size < 100000 );

    // allocate memory
    pMemory = ABC_ALLOC( char, Size * 75 );
    // copy the array into memory
    for ( i = 0; i < Size; i++ )
        for ( k = 0; k < 75; k++ )
            if ( s_Data4[i][k] == ' ' )
                pMemory[i*75+k] = (char)(-1);
            else
                pMemory[i*75+k] = Map[(int)s_Data4[i][k]];

    // set pointers and compute SOP sizes
    pSopSizes = ABC_ALLOC( char, 65536 );
    pSops = ABC_ALLOC( char *, 65536 );
    pSopSizes[0] = 0;
    pSops[0] = NULL;
    pPrev = pMemory;
    for ( k = 0, i = 1; i < 65536; k++ )
        if ( pMemory[k] == (char)(-1) )
        {
            pSopSizes[i] = pMemory + k - pPrev; 
            pSops[i++] = pPrev;
            pPrev = pMemory + k + 1;
        }
    *ppSopSizes = pSopSizes;
    *ppSops = pSops;

    // verify the results - derive truth table from SOP
    for ( i = 1; i < 65536; i++ )
    {
        int uTruth = 0, uCube, Lit;
        for ( k = 0; k < pSopSizes[i]; k++ )
        {
            uCube = 0xFFFF;
            Lit = pSops[i][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Lit % 3 == 0 )
                    uCube &= uMasks[b][0];
                else if ( Lit % 3 == 1 )
                    uCube &= uMasks[b][1];
                Lit = Lit / 3;
            }
            uTruth |= uCube;
        }
        assert( uTruth == i );
    }
}